

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-private.h
# Opt level: O2

double __thiscall Dashel::ParameterSet::get<double>(ParameterSet *this,char *key)

{
  const_iterator cVar1;
  string *psVar2;
  DashelException *this_00;
  allocator<char> local_1c9;
  double local_1c8;
  double t;
  allocator<char> local_1b8 [32];
  istringstream iss;
  uint auStack_180 [90];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&iss,key,local_1b8);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(key_type *)&iss);
  std::__cxx11::string::~string((string *)&iss);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->values)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&iss,(string *)(cVar1._M_node + 2),_S_in);
    *(uint *)((long)auStack_180 + *(long *)(_iss + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(_iss + -0x18)) | 1;
    std::istream::_M_extract<double>((double *)&iss);
    local_1c8 = t;
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    return local_1c8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Parameter missing: ",&local_1c9);
  psVar2 = (string *)std::__cxx11::string::append((char *)local_1b8);
  std::__cxx11::string::string((string *)&iss,psVar2);
  std::__cxx11::string::~string((string *)local_1b8);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException(this_00,InvalidTarget,0,_iss,(Stream *)0x0);
  __cxa_throw(this_00,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T ParameterSet::get(const char* key) const
	{
		T t;
		std::map<std::string, std::string>::const_iterator it = values.find(key);
		if (it == values.end())
		{
			std::string r = std::string("Parameter missing: ").append(key);
			throw Dashel::DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}
		std::istringstream iss(it->second);
		iss >> std::boolalpha >> t;
		return t;
	}